

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_conn.c
# Opt level: O1

void * uo_tcp_conn_get_user_data(uo_tcp_conn *tcp_conn,char *key)

{
  uo_strkvp_linklist *puVar1;
  void *pvVar2;
  
  if (key == (char *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    puVar1 = uo_strhashtbl_find_link((tcp_conn->user_data).links,(tcp_conn->user_data).capacity,key)
    ;
    pvVar2 = (puVar1->item).value;
    if (pvVar2 == (void *)0x0) {
      puVar1 = uo_strhashtbl_find_link
                         (((tcp_conn->field_1).shared_user_data)->links,
                          ((tcp_conn->field_1).shared_user_data)->capacity,key);
      pvVar2 = (puVar1->item).value;
    }
  }
  return pvVar2;
}

Assistant:

void *uo_tcp_conn_get_user_data(
    uo_tcp_conn *tcp_conn,
    const char *key)
{
    void *user_data = uo_strhashtbl_get(&tcp_conn->user_data, key);

    return user_data
        ? user_data
        : uo_strhashtbl_get(tcp_conn->shared_user_data, key);
}